

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::fill(QByteArray *this,char ch,qsizetype size)

{
  size_t __n;
  
  if (size < 0) {
    size = (this->d).size;
  }
  resize(this,size);
  __n = (this->d).size;
  if (__n != 0) {
    memset((this->d).ptr,(uint)(byte)ch,__n);
  }
  return this;
}

Assistant:

QByteArray &QByteArray::fill(char ch, qsizetype size)
{
    resize(size < 0 ? this->size() : size);
    if (this->size())
        memset(d.data(), ch, this->size());
    return *this;
}